

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O0

UBool u_isWhitespace_63(UChar32 c)

{
  uint uVar1;
  int iVar2;
  bool local_2b;
  bool local_2a;
  bool local_29;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  uint32_t props;
  UChar32 c_local;
  
  uVar1 = c >> 5;
  if ((uint)c < 0xd800) {
    local_1c = (uint)propsTrie_index[(int)uVar1] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar2 = 0;
      if (c < 0xdc00) {
        iVar2 = 0x140;
      }
      local_20 = (uint)propsTrie_index[(int)(iVar2 + uVar1)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < 0x110000) {
          local_28 = (uint)propsTrie_index
                           [(int)((uint)propsTrie_index[(c >> 0xb) + 0x820] + (uVar1 & 0x3f))] * 4 +
                     (c & 0x1fU);
        }
        else {
          local_28 = 0x53c8;
        }
        local_24 = local_28;
      }
      else {
        local_24 = 0x11f4;
      }
      local_20 = local_24;
    }
    local_1c = local_20;
  }
  if (((((1 << ((byte)propsTrie_index[local_1c] & 0x1f) & 0x7000U) == 0) || (c == 0xa0)) ||
      (c == 0x2007)) || (local_29 = true, c == 0x202f)) {
    local_2a = false;
    if ((c < 0x20) && (local_2a = false, 8 < c)) {
      local_2b = c < 0xe || 0x1b < c;
      local_2a = local_2b;
    }
    local_29 = local_2a;
  }
  return local_29;
}

Assistant:

U_CAPI UBool U_EXPORT2
u_isWhitespace(UChar32 c) {
    uint32_t props;
    GET_PROPS(c, props);
    return (UBool)(
                ((CAT_MASK(props)&U_GC_Z_MASK)!=0 &&
                    c!=NBSP && c!=FIGURESP && c!=NNBSP) || /* exclude no-break spaces */
                IS_THAT_ASCII_CONTROL_SPACE(c)
           );
}